

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cc
# Opt level: O3

void SimpleLoggerMgr::handleSegAbort(int sig)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 in_register_0000003c;
  string local_38;
  atomic<SimpleLoggerMgr_*> this;
  
  this._M_b._M_p = instance._M_b._M_p;
  if (instance._M_b._M_p == (__pointer_type)0x0) {
    iVar2 = init((EVP_PKEY_CTX *)CONCAT44(in_register_0000003c,sig));
    this._M_b._M_p = (__base_type)CONCAT44(extraout_var,iVar2);
  }
  signal(6,(__sighandler_t)((__pointer_type)this._M_b._M_p)->oldSigAbortHandler);
  enableOnlyOneDisplayer((SimpleLoggerMgr *)this._M_b._M_p);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"Abort","");
  flushAllLoggers((SimpleLoggerMgr *)this._M_b._M_p,1,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  logStackBacktrace((SimpleLoggerMgr *)this._M_b._M_p,60000);
  puts("[ABORT] Flushed all logs safely.");
  fflush(_stdout);
  bVar1 = chkExitOnCrash((SimpleLoggerMgr *)this._M_b._M_p);
  if (bVar1) {
    puts("[ABORT] Exit on crash.");
    fflush(_stdout);
    exit(-1);
  }
  abort();
}

Assistant:

void SimpleLogger::setCriticalInfo(const std::string& info_str) {
    SimpleLoggerMgr* mgr = SimpleLoggerMgr::get();
    if (mgr) {
        mgr->setCriticalInfo(info_str);
    }
}